

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O0

string * CLI::clean_name_string(string *name,string *keyChars)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ulong in_RSI;
  string *in_RDI;
  string *in_stack_00000018;
  string local_30 [40];
  string *local_8;
  
  local_8 = in_RDI;
  lVar2 = ::std::__cxx11::string::find_first_of((string *)in_RDI,in_RSI);
  if ((lVar2 != -1) ||
     (((pcVar3 = (char *)::std::__cxx11::string::front(), *pcVar3 == '[' &&
       (pcVar3 = (char *)::std::__cxx11::string::back(), *pcVar3 == ']')) ||
      (lVar2 = ::std::__cxx11::string::find_first_of((char *)local_8,0x2c8ca4), lVar2 != -1)))) {
    lVar2 = ::std::__cxx11::string::find_first_of((char)local_8,0x27);
    if (lVar2 == -1) {
      ::std::__cxx11::string::insert((ulong)local_8,0,'\x01');
      ::std::__cxx11::string::push_back((char)local_8);
    }
    else {
      bVar1 = detail::has_escapable_character((string *)0x1228b6);
      if (bVar1) {
        detail::add_escaped_characters(in_stack_00000018);
        ::std::__cxx11::string::operator=((string *)local_8,local_30);
        ::std::__cxx11::string::~string(local_30);
      }
      ::std::__cxx11::string::insert((ulong)local_8,0,'\x01');
      ::std::__cxx11::string::push_back((char)local_8);
    }
  }
  return local_8;
}

Assistant:

CLI11_INLINE std::string &clean_name_string(std::string &name, const std::string &keyChars) {
    if(name.find_first_of(keyChars) != std::string::npos || (name.front() == '[' && name.back() == ']') ||
       (name.find_first_of("'`\"\\") != std::string::npos)) {
        if(name.find_first_of('\'') == std::string::npos) {
            name.insert(0, 1, '\'');
            name.push_back('\'');
        } else {
            if(detail::has_escapable_character(name)) {
                name = detail::add_escaped_characters(name);
            }
            name.insert(0, 1, '\"');
            name.push_back('\"');
        }
    }
    return name;
}